

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Str_t * Pdr_ManDumpString(Pdr_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  Vec_Str_t *vStr;
  char *pcVar5;
  Vec_Ptr_t *vCubes;
  void **__dest;
  Vec_Int_t *vFlopCounts;
  long lVar6;
  size_t __size;
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  vStr->pArray = pcVar5;
  iVar4 = Pdr_ManFindInvariantStart(p);
  pVVar3 = p->vInfCubes;
  if (pVVar3 == (Vec_Ptr_t *)0x0) {
    vCubes = Pdr_ManCollectCubes(p,iVar4);
  }
  else {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = pVVar3->nSize;
    vCubes->nSize = iVar4;
    iVar1 = pVVar3->nCap;
    vCubes->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar1 << 3);
    }
    vCubes->pArray = __dest;
    memcpy(__dest,pVVar3->pArray,(long)iVar4 << 3);
  }
  if (1 < (long)vCubes->nSize) {
    qsort(vCubes->pArray,(long)vCubes->nSize,8,Pdr_SetCompare);
  }
  if (p->pPars->fUseSupp == 0) {
    vFlopCounts = (Vec_Int_t *)0x0;
  }
  else {
    vFlopCounts = Pdr_ManCountFlops(p,vCubes);
  }
  if (0 < vCubes->nSize) {
    lVar6 = 0;
    do {
      if (((Pdr_Set_t *)vCubes->pArray[lVar6])->nRefs != -1) {
        Pdr_SetPrintStr(vStr,(Pdr_Set_t *)vCubes->pArray[lVar6],p->pAig->nRegs,vFlopCounts);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCubes->nSize);
  }
  if (vFlopCounts != (Vec_Int_t *)0x0) {
    if (vFlopCounts->pArray != (int *)0x0) {
      free(vFlopCounts->pArray);
      vFlopCounts->pArray = (int *)0x0;
    }
    free(vFlopCounts);
  }
  if (vCubes->pArray != (void **)0x0) {
    free(vCubes->pArray);
    vCubes->pArray = (void **)0x0;
  }
  if (vCubes != (Vec_Ptr_t *)0x0) {
    free(vCubes);
  }
  uVar2 = vStr->nCap;
  if (vStr->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      __size = 0x10;
    }
    else {
      __size = (ulong)uVar2 * 2;
      if ((int)__size <= (int)uVar2) goto LAB_005e616c;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(__size);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,__size);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)__size;
  }
LAB_005e616c:
  iVar4 = vStr->nSize;
  vStr->nSize = iVar4 + 1;
  vStr->pArray[iVar4] = '\0';
  return vStr;
}

Assistant:

Vec_Str_t * Pdr_ManDumpString( Pdr_Man_t * p )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart;
    vStr = Vec_StrAlloc( 1000 );
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( p->vInfCubes == NULL )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
    // collect variable appearances
    vFlopCounts = p->pPars->fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrintStr( vStr, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
    }
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}